

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

bool __thiscall wasm::needsQuoting(wasm *this,Name name)

{
  string *psVar1;
  int iVar2;
  void *__s2;
  bool bVar3;
  undefined1 *local_68;
  string mangled;
  long local_38 [2];
  
  __s2 = name.super_IString.str._M_len;
  psVar1 = (string *)((long)&mangled.field_2 + 8);
  mangled.field_2._8_8_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>(psVar1,__s2,(wasm *)((long)__s2 + (long)this));
  ::wasm::asmangle(&local_68,psVar1);
  if ((long *)mangled.field_2._8_8_ != local_38) {
    operator_delete((void *)mangled.field_2._8_8_,local_38[0] + 1);
  }
  bVar3 = true;
  if ((wasm *)mangled._M_dataplus._M_p == this) {
    if (this != (wasm *)0x0) {
      iVar2 = bcmp(local_68,__s2,(size_t)this);
      if (iVar2 != 0) goto LAB_00138d9c;
    }
    bVar3 = false;
  }
LAB_00138d9c:
  if ((size_type *)local_68 != &mangled._M_string_length) {
    operator_delete(local_68,mangled._M_string_length + 1);
  }
  return bVar3;
}

Assistant:

static bool needsQuoting(Name name) {
  auto mangled = asmangle(name.toString());
  return mangled != name.str;
}